

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManifestLoader.cpp
# Opt level: O0

void __thiscall
llbuild::ninja::ManifestLoader::ManifestLoaderImpl::evalString
          (ManifestLoaderImpl *this,void *userContext,StringRef string,raw_ostream *result,
          function<void_(void_*,_llvm::StringRef,_llvm::raw_ostream_&)> *lookup,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *error)

{
  char c_00;
  int iVar1;
  char *pcVar2;
  bool bVar3;
  bool local_192;
  allocator local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  StringRef local_158;
  char *local_148;
  char *varStart_1;
  long local_138;
  allocator local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  int local_108;
  allocator local_101;
  int c_1;
  byte local_d9;
  char *pcStack_d8;
  bool isValid;
  char *varStart;
  int c;
  StringRef local_a8;
  char *local_98;
  char *pieceStart;
  char *end;
  char *pos;
  function<void_(void_*,_llvm::StringRef,_llvm::raw_ostream_&)> *lookup_local;
  raw_ostream *result_local;
  void *userContext_local;
  ManifestLoaderImpl *this_local;
  StringRef string_local;
  
  string_local.Data = (char *)string.Length;
  this_local = (ManifestLoaderImpl *)string.Data;
  pos = (char *)lookup;
  lookup_local = (function<void_(void_*,_llvm::StringRef,_llvm::raw_ostream_&)> *)result;
  result_local = (raw_ostream *)userContext;
  userContext_local = this;
  end = llvm::StringRef::begin((StringRef *)&this_local);
  pieceStart = llvm::StringRef::end((StringRef *)&this_local);
LAB_00168312:
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          pcVar2 = end;
          if (end == pieceStart) {
            return;
          }
          local_98 = end;
          for (; (end != pieceStart && (*end != '$')); end = end + 1) {
          }
          if (end != pcVar2) {
            string_local.Length = (long)end - (long)pcVar2;
            local_a8.Data = pcVar2;
            local_a8.Length = string_local.Length;
            llvm::raw_ostream::operator<<((raw_ostream *)lookup_local,local_a8);
          }
          if (end == pieceStart) {
            return;
          }
          pcVar2 = end + 1;
          if (pcVar2 == pieceStart) {
            end = pcVar2;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&c,"invalid \'$\'-escape at end of string",
                       (allocator *)((long)&varStart + 7));
            std::
            function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()(error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &c);
            std::__cxx11::string::~string((string *)&c);
            std::allocator<char>::~allocator((allocator<char> *)((long)&varStart + 7));
            return;
          }
          c_00 = *pcVar2;
          varStart._0_4_ = (int)c_00;
          if ((int)varStart != 10) break;
          end = end + 2;
          while( true ) {
            bVar3 = false;
            if (end != pieceStart) {
              iVar1 = isspace((int)*end);
              bVar3 = iVar1 != 0;
            }
            if (!bVar3) break;
            end = end + 1;
          }
        }
        if ((((int)varStart != 0x20) && ((int)varStart != 0x3a)) && ((int)varStart != 0x24)) break;
        end = pcVar2;
        llvm::raw_ostream::operator<<((raw_ostream *)lookup_local,c_00);
        end = end + 1;
      }
      if ((int)varStart == 0x7b) break;
      end = pcVar2;
      bVar3 = Lexer::isSimpleIdentifierChar(c_00);
      if (!bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_178,
                   "invalid \'$\'-escape (literal \'$\' should be written as \'$$\')",&local_179);
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()(error,&local_178);
        std::__cxx11::string::~string((string *)&local_178);
        std::allocator<char>::~allocator((allocator<char> *)&local_179);
        return;
      }
      local_148 = end;
      do {
        end = end + 1;
        local_192 = false;
        if (end != pieceStart) {
          local_192 = Lexer::isSimpleIdentifierChar(*end);
        }
      } while (local_192 != false);
      local_158.Data = local_148;
      local_158.Length = (long)end - (long)local_148;
      std::function<void_(void_*,_llvm::StringRef,_llvm::raw_ostream_&)>::operator()
                (lookup,result_local,local_158,(raw_ostream *)lookup_local);
    }
    local_d9 = 1;
    pcStack_d8 = end + 2;
    for (end = pcStack_d8; end != pieceStart; end = end + 1) {
      local_108 = (int)*end;
      if (local_108 == 0x7d) {
        if ((local_d9 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_128,"invalid variable name in reference",&local_129);
          std::
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::operator()(error,&local_128);
          std::__cxx11::string::~string((string *)&local_128);
          std::allocator<char>::~allocator((allocator<char> *)&local_129);
        }
        else {
          varStart_1 = pcStack_d8;
          local_138 = (long)end - (long)pcStack_d8;
          std::function<void_(void_*,_llvm::StringRef,_llvm::raw_ostream_&)>::operator()
                    (lookup,result_local,_varStart_1,(raw_ostream *)lookup_local);
        }
        end = end + 1;
        goto LAB_00168312;
      }
      bVar3 = Lexer::isIdentifierChar(*end);
      if (!bVar3) {
        local_d9 = 0;
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&c_1,"invalid variable reference in string (missing trailing \'}\')",
               &local_101);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c_1);
    std::__cxx11::string::~string((string *)&c_1);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
  } while( true );
}

Assistant:

void evalString(void* userContext, StringRef string, raw_ostream& result,
                  std::function<void(void*, StringRef, raw_ostream&)> lookup,
                  std::function<void(const std::string&)> error) {
    // Scan the string for escape sequences or variable references, accumulating
    // output pieces as we go.
    const char* pos = string.begin();
    const char* end = string.end();
    while (pos != end) {
      // Find the next '$'.
      const char* pieceStart = pos;
      for (; pos != end; ++pos) {
        if (*pos == '$')
          break;
      }

      // Add the current piece, if non-empty.
      if (pos != pieceStart)
        result << StringRef(pieceStart, pos - pieceStart);

      // If we are at the end, we are done.
      if (pos == end)
        break;

      // Otherwise, we have a '$' character to handle.
      ++pos;
      if (pos == end) {
        error("invalid '$'-escape at end of string");
        break;
      }

      // If this is a newline continuation, skip it and all leading space.
      int c = *pos;
      if (c == '\n') {
        ++pos;
        while (pos != end && isspace(*pos))
          ++pos;
        continue;
      }

      // If this is single character escape, honor it.
      if (c == ' ' || c == ':' || c == '$') {
        result << char(c);
        ++pos;
        continue;
      }

      // If this is a braced variable reference, expand it.
      if (c == '{') {
        // Scan until the end of the reference, checking validity of the
        // identifier name as we go.
        ++pos;
        const char* varStart = pos;
        bool isValid = true;
        while (true) {
          // If we reached the end of the string, this is an error.
          if (pos == end) {
            error(
                "invalid variable reference in string (missing trailing '}')");
            break;
          }

          // If we found the end of the reference, resolve it.
          int c = *pos;
          if (c == '}') {
            // If this identifier isn't valid, emit an error.
            if (!isValid) {
              error("invalid variable name in reference");
            } else {
              lookup(userContext, StringRef(varStart, pos - varStart),
                     result);
            }
            ++pos;
            break;
          }

          // Track whether this is a valid identifier.
          if (!Lexer::isIdentifierChar(c))
            isValid = false;

          ++pos;
        }
        continue;
      }

      // If this is a simple variable reference, expand it.
      if (Lexer::isSimpleIdentifierChar(c)) {
        const char* varStart = pos;
        // Scan until the end of the simple identifier.
        ++pos;
        while (pos != end && Lexer::isSimpleIdentifierChar(*pos))
          ++pos;
        lookup(userContext, StringRef(varStart, pos-varStart), result);
        continue;
      }

      // Otherwise, we have an invalid '$' escape.
      error("invalid '$'-escape (literal '$' should be written as '$$')");
      break;
    }
  }